

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTargetCollectLinkLanguages::~cmTargetCollectLinkLanguages(cmTargetCollectLinkLanguages *this)

{
  std::
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  ::~_Rb_tree(&(this->Visited)._M_t);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmTargetCollectLinkLanguages(cmTarget const* target,
                               const std::string& config,
                               UNORDERED_SET<std::string>& languages,
                               cmTarget const* head):
    Config(config), Languages(languages), HeadTarget(head),
    Makefile(target->GetMakefile()), Target(target)
  { this->Visited.insert(target); }